

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::python::Generator::ModuleLevelServiceDescriptorName_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,ServiceDescriptor *descriptor)

{
  size_t *psVar1;
  char *pcVar2;
  string_view filename;
  string local_e8;
  undefined1 local_c8 [40];
  char *local_a0;
  AlphaNum local_78;
  size_type local_48;
  pointer local_40;
  
  local_78.piece_._M_len = 1;
  local_78.piece_._M_str = "_";
  pcVar2 = (char *)**(undefined8 **)(descriptor + 8);
  local_c8._32_8_ = (*(undefined8 **)(descriptor + 8))[1];
  local_a0 = pcVar2;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_78);
  absl::lts_20240722::AsciiStrToUpper((string *)__return_storage_ptr__);
  if (*(FileDescriptor **)(descriptor + 0x10) != this->file_) {
    psVar1 = *(size_t **)(*(FileDescriptor **)(descriptor + 0x10) + 8);
    filename._M_str = pcVar2;
    filename._M_len = *psVar1;
    (anonymous_namespace)::ModuleAlias_abi_cxx11_
              (&local_e8,(_anonymous_namespace_ *)psVar1[1],filename);
    local_78.piece_._M_len = local_e8._M_string_length;
    local_78.piece_._M_str = local_e8._M_dataplus._M_p;
    local_c8[0x20] = '\x01';
    local_c8[0x21] = '\0';
    local_c8[0x22] = '\0';
    local_c8[0x23] = '\0';
    local_c8[0x24] = '\0';
    local_c8[0x25] = '\0';
    local_c8[0x26] = '\0';
    local_c8[0x27] = '\0';
    local_a0 = ".";
    local_40 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_48 = __return_storage_ptr__->_M_string_length;
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)local_c8,&local_78,(AlphaNum *)(local_c8 + 0x20));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_c8);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelServiceDescriptorName(
    const ServiceDescriptor& descriptor) const {
  std::string name = absl::StrCat("_", descriptor.name());
  absl::AsciiStrToUpper(&name);
  if (descriptor.file() != file_) {
    name = absl::StrCat(ModuleAlias(descriptor.file()->name()), ".", name);
  }
  return name;
}